

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall
QPDF::pushOutlinesToPart<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
          (QPDF *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *lc_outlines,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *object_stream_data)

{
  int *piVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  bool bVar3;
  _Base_ptr p_Var4;
  QPDFObjectHandle outlines;
  QPDFObjGen outlines_og;
  QPDFObjectHandle root;
  undefined1 auStack_78 [16];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68 [2];
  QPDFObjGen local_48;
  QPDF local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  getRoot(&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"/Outlines",(allocator<char> *)&local_48);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)auStack_78,(string *)&local_40);
  std::__cxx11::string::~string((string *)local_68);
  bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)auStack_78);
  if (!bVar3) {
    getUncompressedObject
              ((QPDF *)local_68,(QPDFObjectHandle *)this,
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               auStack_78);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)auStack_78,local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68[0]._M_refcount);
    local_48 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)auStack_78);
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    ((_Var2._M_head_impl)->c_outline_data).first_object = local_48.obj;
    *(int *)((long)&(_Var2._M_head_impl)->c_outline_data + 0x10) = 1;
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::erase(&lc_outlines->_M_t,&local_48);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              (part,(value_type *)auStack_78);
    for (p_Var4 = (lc_outlines->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(lc_outlines->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      getObject((QPDF *)local_68,(QPDFObjGen)this);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
      emplace_back<QPDFObjectHandle>(part,(QPDFObjectHandle *)local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68[0]._M_refcount);
      piVar1 = (int *)((long)&((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                              c_outline_data + 0x10);
      *piVar1 = *piVar1 + 1;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_78 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return;
}

Assistant:

void
QPDF::pushOutlinesToPart(
    std::vector<QPDFObjectHandle>& part,
    std::set<QPDFObjGen>& lc_outlines,
    T const& object_stream_data)
{
    QPDFObjectHandle root = getRoot();
    QPDFObjectHandle outlines = root.getKey("/Outlines");
    if (outlines.isNull()) {
        return;
    }
    outlines = getUncompressedObject(outlines, object_stream_data);
    QPDFObjGen outlines_og(outlines.getObjGen());
    QTC::TC(
        "qpdf",
        "QPDF lin outlines in part",
        ((&part == (&m->part6))       ? 0
             : (&part == (&m->part9)) ? 1
                                      : 9999)); // can't happen
    m->c_outline_data.first_object = outlines_og.getObj();
    m->c_outline_data.nobjects = 1;
    lc_outlines.erase(outlines_og);
    part.push_back(outlines);
    for (auto const& og: lc_outlines) {
        part.push_back(getObject(og));
        ++m->c_outline_data.nobjects;
    }
}